

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# until-done.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Master *this;
  time_t tVar4;
  Link *l;
  ostream *this_00;
  Block *pBVar5;
  void *this_01;
  bool all_done;
  int gid;
  RoundRobinAssigner assigner;
  Master master;
  FileStorage storage;
  int nblocks;
  communicator world;
  environment env;
  size_t in_stack_ffffffffffffe648;
  undefined1 *puVar6;
  communicator *in_stack_ffffffffffffe650;
  Master *this_02;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffe658;
  NeverSkip *__f;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffe660;
  Skip *in_stack_ffffffffffffe680;
  undefined4 in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe68c;
  int in_stack_ffffffffffffe690;
  int in_stack_ffffffffffffe694;
  string *in_stack_ffffffffffffe698;
  FileStorage *in_stack_ffffffffffffe6a0;
  undefined4 in_stack_ffffffffffffe6c0;
  Master *this_03;
  IExchangeInfo *in_stack_ffffffffffffe708;
  int in_stack_ffffffffffffe714;
  Master *in_stack_ffffffffffffe718;
  MemoryManagement *in_stack_ffffffffffffe730;
  undefined1 in_stack_ffffffffffffe73f;
  Master *in_stack_ffffffffffffe740;
  undefined1 local_1810 [43];
  undefined1 local_17e5;
  int local_17e4;
  code *local_17d0;
  NeverSkip local_17c8 [32];
  code *local_17a8;
  undefined1 local_17a0 [72];
  code *local_1758;
  communicator local_1730 [237];
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [128];
  int local_40;
  communicator local_30;
  int local_4;
  
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe650,(int)(in_stack_ffffffffffffe648 >> 0x20),
             (char **)0x10d84d);
  diy::mpi::communicator::communicator(in_stack_ffffffffffffe650);
  local_40 = diy::mpi::communicator::size(&local_30);
  local_40 = local_40 << 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),
             (char *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
             (allocator<char> *)in_stack_ffffffffffffe680);
  diy::FileStorage::FileStorage(in_stack_ffffffffffffe6a0,in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  diy::mpi::communicator::communicator(local_1730,&local_30);
  local_1758 = create_block;
  std::function<void*()>::function<void*(*)(),void>
            ((function<void_*()> *)in_stack_ffffffffffffe660,
             (_func_void_ptr **)in_stack_ffffffffffffe658);
  local_17a0._32_8_ = destroy_block;
  std::function<void(void*)>::function<void(*)(void*),void>
            ((function<void_(void_*)> *)in_stack_ffffffffffffe660,
             (_func_void_void_ptr **)in_stack_ffffffffffffe658);
  local_17a8 = save_block;
  std::function<void(void_const*,diy::BinaryBuffer&)>::
  function<void(*)(void_const*,diy::BinaryBuffer&),void>
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe660,
             in_stack_ffffffffffffe658);
  local_17d0 = load_block;
  std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
  this = (Master *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffe650,in_stack_ffffffffffffe648);
  __f = local_17c8;
  this_02 = (Master *)local_17a0;
  puVar6 = local_c0;
  this_03 = this;
  diy::Master::Master((Master *)master.mt_gen._M_x[0x135],(communicator *)master.mt_gen._M_x[0x134],
                      master.mt_gen._M_x[0x133]._4_4_,(int)master.mt_gen._M_x[0x133],
                      (CreateBlock *)master.mt_gen._M_x[0x132],
                      (DestroyBlock *)master.mt_gen._M_x[0x131],
                      (ExternalStorage *)master.mt_gen._M_x[0x137],
                      (SaveBlock *)master.mt_gen._M_x[0x138],(LoadBlock *)master.mt_gen._M_x[0x139],
                      (QueuePolicy *)master.mt_gen._M_x[0x13a]);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x10da26);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x10da33);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x10da40);
  std::function<void_*()>::~function((function<void_*()> *)0x10da4d);
  diy::mpi::communicator::~communicator((communicator *)0x10da5a);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  iVar1 = diy::mpi::communicator::size(&local_30);
  diy::RoundRobinAssigner::Assigner
            ((RoundRobinAssigner *)this_02,(int)((ulong)puVar6 >> 0x20),(int)puVar6);
  for (local_17e4 = 0; local_17e4 < local_40; local_17e4 = local_17e4 + 1) {
    iVar2 = diy::RoundRobinAssigner::rank
                      ((RoundRobinAssigner *)this_02,(int)((ulong)puVar6 >> 0x20));
    iVar3 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == iVar3) {
      l = (Link *)operator_new(4);
      Block::Block((Block *)l);
      operator_new(0x20);
      diy::Link::Link((Link *)this_02);
      diy::Master::add(this_03,iVar1,(void *)CONCAT44(iVar3,in_stack_ffffffffffffe6c0),l);
    }
  }
  local_17e5 = _S_red >> 0x18;
  while (iVar1 = (int)((ulong)puVar6 >> 0x20), ((local_17e5 ^ 0xff) & 1) != _S_red >> 0x18) {
    local_1810._32_8_ = flip_coin;
    in_stack_ffffffffffffe6a0 = (FileStorage *)local_1810;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              ((Master *)CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),
               (_func_void_Block_ptr_ProxyWithLink_ptr **)
               CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
               in_stack_ffffffffffffe680);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x10dd58);
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)this_02);
    diy::Master::exchange
              (in_stack_ffffffffffffe740,(bool)in_stack_ffffffffffffe73f,in_stack_ffffffffffffe730);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this_02);
    in_stack_ffffffffffffe694 = diy::Master::loaded_block((Master *)0x10ddcd);
    diy::Master::proxy(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714,in_stack_ffffffffffffe708
                      );
    in_stack_ffffffffffffe690 = diy::Master::Proxy::read<int>((Proxy *)this_02);
    local_17e5 = in_stack_ffffffffffffe690 != 0;
    diy::Master::ProxyWithLink::~ProxyWithLink((ProxyWithLink *)0x10de25);
  }
  iVar2 = diy::mpi::communicator::rank(&local_30);
  if (iVar2 == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Total iterations: ");
    diy::Master::loaded_block((Master *)0x10dedf);
    pBVar5 = diy::Master::block<Block>(this_02,iVar1);
    this_01 = (void *)std::ostream::operator<<(this_00,pBVar5->count);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  diy::RoundRobinAssigner::~RoundRobinAssigner((RoundRobinAssigner *)0x10df37);
  diy::Master::~Master(this_02);
  diy::FileStorage::~FileStorage(in_stack_ffffffffffffe6a0);
  diy::mpi::communicator::~communicator((communicator *)0x10df5e);
  diy::mpi::environment::~environment((environment *)0x10df6b);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       nblocks = 4*world.size();

  diy::FileStorage          storage("./DIY.XXXXXX");

  diy::Master               master(world,
                                   -1,
                                   2,
                                   &create_block,
                                   &destroy_block,
                                   &storage,
                                   &save_block,
                                   &load_block);

  srand(static_cast<unsigned int>(time(NULL)));

  //diy::ContiguousAssigner   assigner(world.size(), nblocks);
  diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  for (int gid = 0; gid < nblocks; ++gid)
    if (assigner.rank(gid) == world.rank())
      master.add(gid, new Block, new diy::Link);

  bool all_done = false;
  while (!all_done)
  {
    master.foreach(&flip_coin);
    master.exchange();
    all_done = master.proxy(master.loaded_block()).read<int>();
  }

  if (world.rank() == 0)
    std::cout << "Total iterations: " << master.block<Block>(master.loaded_block())->count << std::endl;
}